

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::HashAggregateDistinctFinalizeEvent::Schedule(HashAggregateDistinctFinalizeEvent *this)

{
  int32_t val;
  idx_t iVar1;
  TaskScheduler *this_00;
  unsigned_long uVar2;
  type args;
  bool bVar3;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  long *local_a0;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_98;
  enable_shared_from_this<duckdb::Event> *local_78;
  shared_ptr<duckdb::Pipeline,_true> *local_70;
  enable_shared_from_this<duckdb::Event> local_68;
  shared_ptr<duckdb::Task,_true> local_58;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  iVar1 = CreateGlobalSources(this);
  this_00 = TaskScheduler::GetScheduler(this->context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  if (iVar1 < uVar2) {
    uVar2 = iVar1;
  }
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = &(this->super_BasePipelineEvent).pipeline;
  local_78 = &(this->super_BasePipelineEvent).super_Event.
              super_enable_shared_from_this<duckdb::Event>;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    args = shared_ptr<duckdb::Pipeline,_true>::operator*(local_70);
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_68);
    make_uniq<duckdb::HashAggregateDistinctFinalizeTask,duckdb::Pipeline&,duckdb::shared_ptr<duckdb::Event,true>,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
              ((duckdb *)&local_a0,args,(shared_ptr<duckdb::Event,_true> *)&local_68,this->op,
               this->gstate);
    shared_ptr<duckdb::Task,_true>::
    shared_ptr<duckdb::HashAggregateDistinctFinalizeTask,_std::default_delete<duckdb::HashAggregateDistinctFinalizeTask>,_true,_0>
              (&local_58,
               (unique_ptr<duckdb::HashAggregateDistinctFinalizeTask,_std::default_delete<duckdb::HashAggregateDistinctFinalizeTask>,_true>
                *)&local_a0);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_98,&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
    local_a0 = (long *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void HashAggregateDistinctFinalizeEvent::Schedule() {
	auto n_tasks = CreateGlobalSources();
	n_tasks = MinValue<idx_t>(n_tasks, NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads()));
	vector<shared_ptr<Task>> tasks;
	for (idx_t i = 0; i < n_tasks; i++) {
		tasks.push_back(make_uniq<HashAggregateDistinctFinalizeTask>(*pipeline, shared_from_this(), op, gstate));
	}
	SetTasks(std::move(tasks));
}